

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *stream,Response *resp)

{
  long lVar1;
  element_type *peVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  stringstream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(resp->protocol)._M_dataplus._M_p,(resp->protocol)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(resp->status).status._M_dataplus._M_p,
                      (resp->status).status._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Date: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(resp->date)._M_dataplus._M_p,(resp->date)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Server: ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(resp->server)._M_dataplus._M_p,(resp->server)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Content-Length: ",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Connection: ",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(resp->connection)._M_dataplus._M_p,(resp->connection)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Content-Type: ",0xe);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(resp->content_type)._M_dataplus._M_p,
                      (resp->content_type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_1d0,local_1c8);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if ((resp->body).
      super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    uVar4 = resp->content_length;
    if (0x18fff < uVar4) {
      lVar1 = *in_FS_OFFSET;
      uVar5 = 0;
      do {
        std::istream::read((char *)(resp->body).
                                   super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,lVar1 + -0x19000);
        std::ostream::write((char *)stream,lVar1 + -0x19000);
        uVar5 = uVar5 + 1;
        uVar4 = resp->content_length;
      } while (uVar5 < uVar4 / 0x19000);
    }
    if (uVar4 != (uVar4 / 0x19000) * 0x19000) {
      lVar1 = *in_FS_OFFSET;
      std::istream::read((char *)(resp->body).
                                 super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,lVar1 + -0x19000);
      std::ostream::write((char *)stream,lVar1 + -0x19000);
    }
    peVar2 = (resp->body).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::ios::clear((int)peVar2 + (int)*(undefined8 *)(*(long *)peVar2 + -0x18));
    std::istream::seekg((long)(resp->body).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return stream;
}

Assistant:

T& operator<<(T& stream, const Response& resp) {
    std::stringstream ss;
    ss  << resp.protocol << " " << resp.status.code    << " " << resp.status.status << "\r\n"
        << "Date: "             << resp.date           << "\r\n"
        << "Server: "           << resp.server         << "\r\n"
        << "Content-Length: "   << resp.content_length << "\r\n"
        << "Connection: "       << resp.connection     << "\r\n"
        << "Content-Type: "     << resp.content_type   << "\r\n"
        << "\r\n";

    stream << ss.str();

    if (resp.body) {
        size_t bytes_count = BUFFER_SIZE * sizeof(Byte); 

        for (unsigned long i = 0; i < resp.content_length / bytes_count; i++) {
            resp.body->read(static_cast<char*>(buff), bytes_count);
            stream.write(static_cast<char*>(buff), bytes_count);
        }
        if (resp.content_length % bytes_count) {
            resp.body->read(static_cast<char*>(buff), resp.content_length % bytes_count);
            stream.write(static_cast<char*>(buff), resp.content_length % bytes_count);
        }

        resp.body->clear();
        resp.body->seekg(0, std::ios::beg);
    }

    return stream;
}